

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>,_bool>
 __thiscall
ArgumentParser::PositionActionMap::Emplace
          (PositionActionMap *this,size_t pos,PositionAction *action)

{
  pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *ppVar1;
  __normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>,_bool>
  pVar6;
  size_t local_8;
  
  __position._M_current =
       (this->
       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ).
       super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           ).
           super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)ppVar1 - (long)__position._M_current;
  if (0 < (long)uVar3) {
    uVar3 = (uVar3 >> 3) * -0x3333333333333333;
    do {
      uVar4 = uVar3 >> 1;
      uVar5 = uVar4;
      if (__position._M_current[uVar4].first < pos) {
        uVar5 = ~uVar4 + uVar3;
        __position._M_current = __position._M_current + uVar4 + 1;
      }
      uVar3 = uVar5;
    } while (0 < (long)uVar5);
  }
  if ((__position._M_current == ppVar1) || ((__position._M_current)->first != pos)) {
    local_8 = pos;
    __position._M_current =
         (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
          *)std::
            vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>
            ::
            _M_emplace_aux<unsigned_long&,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>
                      ((vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>
                        *)this,__position._M_current,&local_8,action);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar2 = 0;
  }
  pVar6._8_8_ = uVar2;
  pVar6.first._M_current = __position._M_current;
  return pVar6;
}

Assistant:

auto PositionActionMap::Emplace(std::size_t pos, PositionAction action)
  -> std::pair<iterator, bool>
{
  auto const it = std::lower_bound(
    this->begin(), this->end(), pos,
    [](value_type const& elem, std::size_t k) { return elem.first < k; });
  return (it != this->end() && it->first == pos)
    ? std::make_pair(it, false)
    : std::make_pair(this->emplace(it, pos, std::move(action)), true);
}